

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

void __thiscall
pbrt::RGBFilm::RGBFilm
          (RGBFilm *this,FilmBaseParameters *p,RGBColorSpace *colorSpace,Float maxComponentValue,
          bool writeFP16,Allocator alloc)

{
  float fVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  ulong uVar5;
  PixelSensor *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  short sVar9;
  undefined1 (*pauVar10) [64];
  int i;
  int iVar11;
  long lVar12;
  int iVar13;
  SquareMatrix<3> *pSVar14;
  PixelSensor *pPVar15;
  GaussianFilter *this_00;
  long lVar16;
  PixelSensor *pPVar17;
  int k;
  long lVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float fVar22;
  undefined1 auVar23 [16];
  SquareMatrix<3> r;
  undefined1 auStack_b8 [8];
  Float local_b0;
  Float local_ac [9];
  undefined1 auStack_88 [48];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  auStack_88._16_8_ = (p->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  auStack_88._0_8_ = (p->fullResolution).super_Tuple2<pbrt::Point2,_int>;
  auStack_88._8_8_ = (p->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  auStack_88._24_8_ =
       (p->filter).
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       .bits;
  auStack_88._32_4_ = p->diagonal;
  auStack_88._36_4_ = *(undefined4 *)&p->field_0x24;
  auStack_88._40_8_ = p->sensor;
  pcVar4 = (p->filename)._M_dataplus._M_p;
  local_b0 = maxComponentValue;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar4,pcVar4 + (p->filename)._M_string_length);
  FilmBase::FilmBase(&this->super_FilmBase,(FilmBaseParameters *)auStack_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  this->colorSpace = colorSpace;
  this->maxComponentValue = local_b0;
  this->writeFP16 = writeFP16;
  lVar12 = 0;
  pSVar14 = &this->outputRGBFromSensorRGB;
  do {
    auVar19 = vpbroadcastq_avx512f();
    uVar7 = vpcmpeqq_avx512f(auVar19,_DAT_02d27d40);
    uVar8 = vpcmpeqq_avx512f(auVar19,_DAT_02d27d80);
    auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar8,(char)uVar7));
    auVar19 = vpsrld_avx512f(auVar19,0x1f);
    auVar19 = vcvtdq2ps_avx512f(auVar19);
    auVar19._12_4_ = pSVar14->m[1][0];
    auVar19._16_4_ = pSVar14->m[1][1];
    auVar19._20_4_ = pSVar14->m[1][2];
    auVar19._24_4_ = pSVar14->m[2][0];
    auVar19._28_4_ = pSVar14->m[2][1];
    auVar19._32_4_ = pSVar14->m[2][2];
    auVar19._36_4_ =
         (((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar14 + 1))->extent).pMin.
         super_Tuple2<pbrt::Point2,_int>.x;
    auVar19._40_4_ =
         (((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar14 + 1))->extent).pMin.
         super_Tuple2<pbrt::Point2,_int>.y;
    auVar19._44_4_ =
         (((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar14 + 1))->extent).pMax.
         super_Tuple2<pbrt::Point2,_int>.x;
    auVar19._48_4_ =
         (((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar14 + 1))->extent).pMax.
         super_Tuple2<pbrt::Point2,_int>.y;
    auVar19._52_4_ =
         *(undefined4 *)
          &(((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar14 + 1))->allocator).memoryResource;
    auVar19._56_4_ =
         *(undefined4 *)
          ((long)&(((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar14 + 1))->allocator).memoryResource + 4);
    auVar19._60_4_ = *(undefined4 *)&((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar14 + 1))->values;
    *(undefined1 (*) [64])pSVar14 = auVar19;
    lVar12 = lVar12 + 1;
    pSVar14 = (SquareMatrix<3> *)(pSVar14->m + 1);
  } while (lVar12 != 3);
  Array2D<pbrt::RGBFilm::Pixel>::Array2D
            (&this->pixels,&p->pixelBounds,(allocator_type)alloc.memoryResource);
  uVar5 = (this->super_FilmBase).filter.
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          .bits;
  this_00 = (GaussianFilter *)(uVar5 & 0xffffffffffff);
  sVar9 = (short)(uVar5 >> 0x30);
  if (uVar5 >> 0x30 < 3) {
    if (sVar9 == 2) {
      fVar22 = GaussianFilter::Integral(this_00);
    }
    else {
      fVar22 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x;
      fVar22 = fVar22 + fVar22;
      fVar22 = (fVar22 + fVar22) * (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.y;
    }
  }
  else if (uVar5 >> 0x30 == 4) {
    fVar22 = LanczosSincFilter::Integral((LanczosSincFilter *)this_00);
  }
  else if (sVar9 == 3) {
    fVar22 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x *
             (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.y * 0.25;
  }
  else {
    fVar1 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x;
    fVar22 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.y;
    fVar22 = fVar22 * fVar1 * fVar1 * fVar22;
  }
  this->filterIntegral = fVar22;
  iVar2 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar11 = iVar2 - iVar3;
  if ((iVar11 != 0 && iVar3 <= iVar2) &&
     (iVar2 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y,
     iVar3 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y,
     iVar13 = iVar2 - iVar3, iVar13 != 0 && iVar3 <= iVar2)) {
    if (colorSpace != (RGBColorSpace *)0x0) {
      *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) + (long)(iVar13 * iVar11) * 0x38;
      pPVar6 = (this->super_FilmBase).sensor;
      lVar12 = 0;
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      pauVar10 = (undefined1 (*) [64])auStack_b8;
      do {
        auVar21 = vpbroadcastq_avx512f();
        uVar7 = vpcmpeqq_avx512f(auVar21,auVar19);
        uVar8 = vpcmpeqq_avx512f(auVar21,auVar20);
        auVar21 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar8,(char)uVar7));
        auVar21 = vpsrld_avx512f(auVar21,0x1f);
        auVar21 = vcvtdq2ps_avx512f(auVar21);
        auVar21._12_4_ = *(undefined4 *)(*pauVar10 + 0x18);
        auVar21._16_4_ = *(undefined4 *)(*pauVar10 + 0x1c);
        auVar21._20_4_ = *(undefined4 *)(*pauVar10 + 0x20);
        auVar21._24_4_ = *(undefined4 *)(*pauVar10 + 0x24);
        auVar21._28_4_ = *(undefined4 *)(*pauVar10 + 0x28);
        auVar21._32_4_ = *(undefined4 *)(*pauVar10 + 0x2c);
        auVar21._36_4_ = *(undefined4 *)(*pauVar10 + 0x30);
        auVar21._40_4_ = *(undefined4 *)(*pauVar10 + 0x34);
        auVar21._44_4_ = *(undefined4 *)(*pauVar10 + 0x38);
        auVar21._48_4_ = *(undefined4 *)(*pauVar10 + 0x3c);
        auVar21._52_4_ = *(undefined4 *)pauVar10[1];
        auVar21._56_4_ = *(undefined4 *)(pauVar10[1] + 4);
        auVar21._60_4_ = *(undefined4 *)(pauVar10[1] + 8);
        *(undefined1 (*) [64])(*pauVar10 + 0xc) = auVar21;
        lVar12 = lVar12 + 1;
        pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0xc);
      } while (lVar12 != 3);
      pSVar14 = &colorSpace->RGBFromXYZ;
      lVar12 = 0;
      do {
        lVar16 = 0;
        pPVar15 = pPVar6;
        do {
          local_ac[lVar12 * 3 + lVar16] = 0.0;
          auVar23 = ZEXT816(0) << 0x40;
          lVar18 = 0;
          pPVar17 = pPVar15;
          do {
            auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)pSVar14->m[0][lVar18]),
                                      ZEXT416((uint)(pPVar17->XYZFromSensorRGB).m[0][0]));
            lVar18 = lVar18 + 1;
            pPVar17 = (PixelSensor *)((pPVar17->XYZFromSensorRGB).m + 1);
          } while (lVar18 != 3);
          local_ac[lVar12 * 3 + lVar16] = auVar23._0_4_;
          lVar16 = lVar16 + 1;
          pPVar15 = (PixelSensor *)((pPVar15->XYZFromSensorRGB).m[0] + 1);
        } while (lVar16 != 3);
        lVar12 = lVar12 + 1;
        pSVar14 = (SquareMatrix<3> *)(pSVar14->m + 1);
      } while (lVar12 != 3);
      (this->outputRGBFromSensorRGB).m[2][2] = local_ac[8];
      *(undefined8 *)(this->outputRGBFromSensorRGB).m[0] = local_ac._0_8_;
      *(undefined8 *)((this->outputRGBFromSensorRGB).m[0] + 2) = local_ac._8_8_;
      *(undefined8 *)((this->outputRGBFromSensorRGB).m[1] + 1) = local_ac._16_8_;
      *(undefined8 *)(this->outputRGBFromSensorRGB).m[2] = local_ac._24_8_;
      return;
    }
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
               ,500,"Check failed: %s",(char (*) [22])"colorSpace != nullptr");
  }
  LogFatal<char_const(&)[23]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,499,"Check failed: %s",(char (*) [23])"!pixelBounds.IsEmpty()");
}

Assistant:

RGBFilm::RGBFilm(FilmBaseParameters p, const RGBColorSpace *colorSpace,
                 Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      pixels(p.pixelBounds, alloc),
      colorSpace(colorSpace),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16) {
    filterIntegral = filter.Integral();
    CHECK(!pixelBounds.IsEmpty());
    CHECK(colorSpace != nullptr);
    filmPixelMemory += pixelBounds.Area() * sizeof(Pixel);
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;
}